

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latency_Coding_Encode_Decode_Results.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_t tVar1;
  Clock *this;
  SignalGenerator_param *this_00;
  void *pvVar2;
  char *__s;
  Population *n_from;
  LatencyDecodingSynapse *this_01;
  LatencyDecodingSynapse_param *this_02;
  Population *n_to;
  Network_param *this_03;
  Network *this_04;
  ostream *this_05;
  long in_RSI;
  int in_EDI;
  Network n;
  Network_param *n_param;
  LatencyDecodingSynapse *s2;
  LatencyDecodingSynapse_param *params2;
  LatencyEncodingSynapse *s1;
  LatencyEncodingSynapse_param *params1;
  Population *p4;
  Population *p3;
  Population *p1;
  SignalGenerator_param *paramp1;
  double variance;
  double mean;
  double dt;
  double window_length_s;
  double sine7;
  double sine6;
  double sine5;
  double sine4;
  double sine3;
  double sine2;
  double sine1;
  Synapse *in_stack_fffffffffffffe08;
  Network *in_stack_fffffffffffffe10;
  LatencyEncodingSynapse_param *in_stack_fffffffffffffe28;
  Population *in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe40;
  LatencyDecodingSynapse *this_06;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_07;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 uVar3;
  _Alloc_hider in_stack_fffffffffffffef7;
  string local_108 [4];
  int in_stack_fffffffffffffefc;
  Population *in_stack_ffffffffffffff00;
  allocator<char> local_d9;
  Parameters *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  Population *in_stack_ffffffffffffff40;
  allocator<char> local_99;
  string local_98 [32];
  void *local_78;
  SignalGenerator_param *local_70;
  double local_68;
  double local_60;
  double local_58;
  _func_int **local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  local_18 = 1.0;
  local_20 = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = (_func_int **)0x3fb999999999999a;
  local_58 = 0.0001;
  local_60 = 0.0;
  local_68 = 0.0;
  if (9 < local_8) {
    local_18 = atof(*(char **)(local_10 + 8));
    local_20 = atof(*(char **)(local_10 + 0x10));
    local_28 = atof(*(char **)(local_10 + 0x18));
    local_30 = atof(*(char **)(local_10 + 0x20));
    local_38 = atof(*(char **)(local_10 + 0x28));
    local_40 = atof(*(char **)(local_10 + 0x30));
    local_48 = atof(*(char **)(local_10 + 0x38));
    local_50 = (_func_int **)atof(*(char **)(local_10 + 0x40));
    local_58 = atof(*(char **)(local_10 + 0x48));
  }
  if (local_8 == 0xc) {
    local_60 = atof(*(char **)(local_10 + 0x50));
    local_68 = atof(*(char **)(local_10 + 0x58));
  }
  this = Clock::getInstance();
  Clock::setDt(this,local_58);
  this_00 = (SignalGenerator_param *)operator_new(0x58);
  this_00->offset = 0.0;
  this_00->noiseMean = 0.0;
  this_00->f7 = 0.0;
  this_00->scale = 0.0;
  this_00->f5 = 0.0;
  this_00->f6 = 0.0;
  this_00->f3 = 0.0;
  this_00->f4 = 0.0;
  this_00->f1 = 0.0;
  this_00->f2 = 0.0;
  this_00->noiseStd = 0.0;
  SignalGenerator_param::SignalGenerator_param(this_00);
  this_00->f1 = local_18;
  this_00->f2 = local_20;
  this_00->f3 = local_28;
  this_00->f4 = local_30;
  this_00->f5 = local_38;
  this_00->f6 = local_40;
  this_00->f7 = local_48;
  this_00->scale = 0.0625;
  this_00->offset = 0.5;
  this_00->noiseMean = local_60;
  this_00->noiseStd = local_68;
  local_70 = this_00;
  pvVar2 = operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  Population::Population
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_78 = pvVar2;
  operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  Population::Population
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
             (string *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::allocator<char>::~allocator(&local_d9);
  __s = (char *)operator_new(0x60);
  uVar3 = 1;
  this_07 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffef7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_07,__s,in_stack_fffffffffffffe40);
  Population::Population
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
             (string *)CONCAT17(in_stack_fffffffffffffef7,CONCAT16(uVar3,in_stack_fffffffffffffef0))
            );
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  n_from = (Population *)operator_new(8);
  n_from->_vptr_Population = (_func_int **)0x0;
  LatencyEncodingSynapse_param::LatencyEncodingSynapse_param((LatencyEncodingSynapse_param *)n_from)
  ;
  n_from->_vptr_Population = local_50;
  this_01 = (LatencyDecodingSynapse *)operator_new(0x68);
  LatencyEncodingSynapse::LatencyEncodingSynapse
            ((LatencyEncodingSynapse *)this_01,n_from,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  this_06 = this_01;
  this_02 = (LatencyDecodingSynapse_param *)operator_new(0x10);
  this_02->window_length_s = 0.0;
  this_02->delay_s = 0.0;
  LatencyDecodingSynapse_param::LatencyDecodingSynapse_param(this_02);
  this_02->window_length_s = (double)local_50;
  n_to = (Population *)operator_new(0x68);
  LatencyDecodingSynapse::LatencyDecodingSynapse(this_06,n_from,n_to,this_02);
  this_03 = (Network_param *)operator_new(8);
  this_03->dt = 0.0;
  Network_param::Network_param(this_03);
  this_03->dt = local_58;
  Network::Network((Network *)this_06,(Network_param *)n_from);
  Network::add(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Network::add(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  this_04 = (Network *)std::ostream::operator<<((ostream *)&std::cout,(long)n_to);
  std::ostream::operator<<((ostream *)this_04,std::endl<char,std::char_traits<char>>);
  this_05 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(long)this_01);
  std::ostream::operator<<(this_05,std::endl<char,std::char_traits<char>>);
  Network::run((Network *)this_06,(double)n_from);
  local_4 = 0;
  Network::~Network(this_04);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) 
{
    srand(time(NULL));

    // Command line arguments
    double sine1 = 1;
    double sine2 = 0;
    double sine3 = 0;
    double sine4 = 0;
    double sine5 = 0;
    double sine6 = 0;
    double sine7 = 0;
    double window_length_s = 0.1;
    double dt = 0.0001;
    double mean = 0;
    double variance = 0;
    if(argc >= 10) {
        sine1 = atof(argv[1]);
        sine2 = atof(argv[2]);
        sine3 = atof(argv[3]);
        sine4 = atof(argv[4]);
        sine5 = atof(argv[5]);
        sine6 = atof(argv[6]);
        sine7 = atof(argv[7]);
        window_length_s = atof(argv[8]);
        dt = atof(argv[9]);
    }
    if(argc == 12) {
        mean = atof(argv[10]);
        variance = atof(argv[11]);
    }
    // ----------------------

    Clock::getInstance()->setDt(dt);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = sine1;
    paramp1->f2 = sine2;
    paramp1->f3 = sine3;
    paramp1->f4 = sine4;
    paramp1->f5 = sine5;
    paramp1->f6 = sine6;
    paramp1->f7 = sine7;
    paramp1->scale = 1/16.0;
    paramp1->offset = 0.5;
    paramp1->noiseMean = mean;
    paramp1->noiseStd = variance;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    Population* p3 = new Population(1, "PassThrough");
    Population* p4 = new Population(1, "PassThrough");

    // Synapses
    LatencyEncodingSynapse_param* params1 = new LatencyEncodingSynapse_param();
    params1->window_length_s = window_length_s;
    LatencyEncodingSynapse* s1 = new LatencyEncodingSynapse(p1, p3, params1);

    LatencyDecodingSynapse_param* params2 = new LatencyDecodingSynapse_param();
    params2->window_length_s = window_length_s;
    LatencyDecodingSynapse* s2 = new LatencyDecodingSynapse(p3, p4, params2);

    // Create the network
    Network_param* n_param = new Network_param();
    n_param->dt = dt;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);

    cout << (long)s2 << endl;
    cout << (long)s1 << endl;

    // Run the network for 100 second
    n.run(1.0);
    
    return 0;
}